

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderBuiltinVarTests.cpp
# Opt level: O2

TestCaseGroup * vkt::sr::createBuiltinVarTests(TestContext *testCtx)

{
  undefined4 uVar1;
  char *__s;
  TestCaseGroup *pTVar2;
  TestCaseGroup *this;
  TestNode *pTVar3;
  uint uVar4;
  long lVar5;
  allocator<char> local_c2;
  allocator<char> local_c1;
  TestContext *local_c0;
  string typeString;
  string local_98;
  MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> simpleGroup;
  MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> frontFacingGroup;
  MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> inputVariationsGroup;
  MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> builtinGroup;
  
  pTVar2 = (TestCaseGroup *)operator_new(0x70);
  local_c0 = testCtx;
  tcu::TestCaseGroup::TestCaseGroup(pTVar2,testCtx,"builtin_var","Shader builtin variable tests.");
  builtinGroup.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.
  ptr = pTVar2;
  pTVar2 = (TestCaseGroup *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup(pTVar2,local_c0,"simple","Simple cases.");
  simpleGroup.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.
  ptr = pTVar2;
  pTVar2 = (TestCaseGroup *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            (pTVar2,local_c0,"input_variations","Input type variation tests.");
  inputVariationsGroup.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>
  .m_data.ptr = pTVar2;
  this = (TestCaseGroup *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup(this,local_c0,"frontfacing","Test gl_Frontfacing keyword.");
  pTVar2 = simpleGroup.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>
           .m_data.ptr;
  frontFacingGroup.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
  m_data.ptr = this;
  pTVar3 = (TestNode *)operator_new(0x70);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&typeString,"fragcoord_xyz",&local_c2);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_98,"FragCoord xyz test",&local_c1);
  TestCase::TestCase((TestCase *)pTVar3,local_c0,&typeString,&local_98);
  pTVar3->_vptr_TestNode = (_func_int **)&PTR__TestCase_00bfe7d8;
  tcu::TestNode::addChild(&pTVar2->super_TestNode,pTVar3);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&typeString);
  pTVar2 = simpleGroup.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>
           .m_data.ptr;
  pTVar3 = (TestNode *)operator_new(0x70);
  std::__cxx11::string::string<std::allocator<char>>((string *)&typeString,"fragcoord_w",&local_c2);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_98,"FragCoord w test",&local_c1);
  TestCase::TestCase((TestCase *)pTVar3,local_c0,&typeString,&local_98);
  pTVar3->_vptr_TestNode = (_func_int **)&PTR__TestCase_00bfe898;
  tcu::TestNode::addChild(&pTVar2->super_TestNode,pTVar3);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&typeString);
  pTVar2 = simpleGroup.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>
           .m_data.ptr;
  pTVar3 = (TestNode *)operator_new(0x70);
  std::__cxx11::string::string<std::allocator<char>>((string *)&typeString,"pointcoord",&local_c2);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_98,"PointCoord test",&local_c1);
  TestCase::TestCase((TestCase *)pTVar3,local_c0,&typeString,&local_98);
  pTVar3->_vptr_TestNode = (_func_int **)&PTR__TestCase_00bfe958;
  tcu::TestNode::addChild(&pTVar2->super_TestNode,pTVar3);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&typeString);
  for (lVar5 = 0;
      pTVar2 = frontFacingGroup.
               super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.
               ptr, lVar5 != 0x78; lVar5 = lVar5 + 0x18) {
    pTVar3 = (TestNode *)operator_new(0x78);
    uVar1 = *(undefined4 *)((long)&createBuiltinVarTests::frontfacingCases[0].primitive + lVar5);
    __s = *(char **)((long)&createBuiltinVarTests::frontfacingCases[0].desc + lVar5);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&typeString,
               *(char **)((long)&createBuiltinVarTests::frontfacingCases[0].name + lVar5),&local_c2)
    ;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_98,__s,&local_c1);
    TestCase::TestCase((TestCase *)pTVar3,local_c0,&typeString,&local_98);
    std::__cxx11::string::~string((string *)&local_98);
    std::__cxx11::string::~string((string *)&typeString);
    pTVar3->_vptr_TestNode = (_func_int **)&PTR__TestCase_00bfea18;
    *(undefined4 *)&pTVar3[1]._vptr_TestNode = uVar1;
    tcu::TestNode::addChild(&pTVar2->super_TestNode,pTVar3);
  }
  frontFacingGroup.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
  m_data.ptr = (TestCaseGroup *)0x0;
  tcu::TestNode::addChild
            (&(builtinGroup.
               super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.
              ptr)->super_TestNode,&pTVar2->super_TestNode);
  pTVar2 = simpleGroup.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>
           .m_data.ptr;
  simpleGroup.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.
  ptr = (TestCaseGroup *)0x0;
  tcu::TestNode::addChild
            (&(builtinGroup.
               super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.
              ptr)->super_TestNode,&pTVar2->super_TestNode);
  for (uVar4 = 0;
      pTVar2 = inputVariationsGroup.
               super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.
               ptr, uVar4 != 8; uVar4 = uVar4 + 1) {
    pTVar3 = (TestNode *)operator_new(0x78);
    std::__cxx11::string::string<std::allocator<char>>((string *)&typeString,"input",&local_c2);
    if (uVar4 == 0) {
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_98,"input_none",&local_c2)
      ;
    }
    else {
      if ((uVar4 & 1) != 0) {
        std::__cxx11::string::append((char *)&typeString);
      }
      if ((uVar4 & 2) != 0) {
        std::__cxx11::string::append((char *)&typeString);
      }
      if (3 < uVar4) {
        std::__cxx11::string::append((char *)&typeString);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)typeString._M_dataplus._M_p == &typeString.field_2) {
        local_98.field_2._8_8_ = typeString.field_2._8_8_;
        local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
      }
      else {
        local_98._M_dataplus._M_p = typeString._M_dataplus._M_p;
      }
      local_98.field_2._M_allocated_capacity._1_7_ = typeString.field_2._M_allocated_capacity._1_7_;
      local_98.field_2._M_local_buf[0] = typeString.field_2._M_local_buf[0];
      local_98._M_string_length = typeString._M_string_length;
      typeString._M_string_length = 0;
      typeString.field_2._M_local_buf[0] = '\0';
      typeString._M_dataplus._M_p = (pointer)&typeString.field_2;
    }
    std::__cxx11::string::~string((string *)&typeString);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&typeString,"Input variation test",&local_c2);
    TestCase::TestCase((TestCase *)pTVar3,local_c0,&local_98,&typeString);
    pTVar3->_vptr_TestNode = (_func_int **)&PTR__TestCase_00bfeb38;
    *(short *)&pTVar3[1]._vptr_TestNode = (short)uVar4;
    tcu::TestNode::addChild(&pTVar2->super_TestNode,pTVar3);
    std::__cxx11::string::~string((string *)&typeString);
    std::__cxx11::string::~string((string *)&local_98);
  }
  inputVariationsGroup.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>
  .m_data.ptr = (TestCaseGroup *)0x0;
  tcu::TestNode::addChild
            (&(builtinGroup.
               super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.
              ptr)->super_TestNode,&pTVar2->super_TestNode);
  pTVar2 = builtinGroup.
           super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.ptr;
  builtinGroup.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.
  ptr = (TestCaseGroup *)0x0;
  de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::~UniqueBase
            (&frontFacingGroup.
              super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>);
  de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::~UniqueBase
            (&inputVariationsGroup.
              super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>);
  de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::~UniqueBase
            (&simpleGroup.
              super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>);
  de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::~UniqueBase
            (&builtinGroup.
              super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>);
  return pTVar2;
}

Assistant:

TestCaseGroup* createBuiltinVarTests (TestContext& testCtx)
{
	de::MovePtr<TestCaseGroup> builtinGroup			(new TestCaseGroup(testCtx, "builtin_var", "Shader builtin variable tests."));
	de::MovePtr<TestCaseGroup> simpleGroup			(new TestCaseGroup(testCtx, "simple", "Simple cases."));
	de::MovePtr<TestCaseGroup> inputVariationsGroup	(new TestCaseGroup(testCtx, "input_variations", "Input type variation tests."));
	de::MovePtr<TestCaseGroup> frontFacingGroup		(new TestCaseGroup(testCtx, "frontfacing", "Test gl_Frontfacing keyword."));

	simpleGroup->addChild(new BuiltinGlFragCoordXYZCase(testCtx, "fragcoord_xyz", "FragCoord xyz test"));
	simpleGroup->addChild(new BuiltinGlFragCoordWCase(testCtx, "fragcoord_w", "FragCoord w test"));
	simpleGroup->addChild(new BuiltinGlPointCoordCase(testCtx, "pointcoord", "PointCoord test"));

	// gl_FrontFacing tests
	{
		static const struct PrimitiveTable
		{
			const char*				name;
			const char*				desc;
			VkPrimitiveTopology		primitive;
		} frontfacingCases[] =
		{
			{ "point_list",		"Test that points are frontfacing",							VK_PRIMITIVE_TOPOLOGY_POINT_LIST },
			{ "line_list",		"Test that lines are frontfacing",							VK_PRIMITIVE_TOPOLOGY_LINE_LIST },
			{ "triangle_list",	"Test that triangles can be frontfacing or backfacing",		VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST },
			{ "triangle_strip",	"Test that traiangle strips can be front or back facing",	VK_PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP },
			{ "triangle_fan",	"Test that triangle fans can be front or back facing",		VK_PRIMITIVE_TOPOLOGY_TRIANGLE_FAN },
		};

		for (deUint32 ndx = 0; ndx < DE_LENGTH_OF_ARRAY(frontfacingCases); ndx++)
			frontFacingGroup->addChild(new BuiltinGlFrontFacingCase(testCtx, frontfacingCases[ndx].primitive, frontfacingCases[ndx].name, frontfacingCases[ndx].desc));
	}

	builtinGroup->addChild(frontFacingGroup.release());
	builtinGroup->addChild(simpleGroup.release());

	for (deUint16 shaderType = 0; shaderType <= (SHADER_INPUT_BUILTIN_BIT | SHADER_INPUT_VARYING_BIT | SHADER_INPUT_CONSTANT_BIT); ++shaderType)
	{
		inputVariationsGroup->addChild(new BuiltinInputVariationsCase(testCtx, shaderInputTypeToString(shaderType), "Input variation test", shaderType));
	}

	builtinGroup->addChild(inputVariationsGroup.release());
	return builtinGroup.release();
}